

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ContinuousAssignSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ContinuousAssignSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DriveStrengthSyntax*,slang::syntax::TimingControlSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DriveStrengthSyntax **args_2,TimingControlSyntax **args_3,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_4,Token *args_5)

{
  Token assign;
  Token semi;
  ContinuousAssignSyntax *this_00;
  
  this_00 = (ContinuousAssignSyntax *)allocate(this,0xb8,8);
  assign.kind = args_1->kind;
  assign._2_1_ = args_1->field_0x2;
  assign.numFlags.raw = (args_1->numFlags).raw;
  assign.rawLen = args_1->rawLen;
  assign.info = args_1->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  syntax::ContinuousAssignSyntax::ContinuousAssignSyntax
            (this_00,args,assign,*args_2,*args_3,args_4,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }